

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

int __thiscall
so_5::disp::active_obj::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::shutdown(dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
           *this,int __fd,int __how)

{
  int iVar1;
  
  std::mutex::lock(&this->m_lock);
  this->m_shutdown_started = true;
  __std__for_each<std::_Rb_tree_iterator<std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>>>,void(*)(std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>>&)>_std___Rb_tree_iterator<std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>>>_std___Rb_tree_iterator<std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>>>_void____std__pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>>____
            ((this->m_agent_threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_iterator<std::pair<const_so_5::agent_t_*const,_std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>_>_>
              )&(this->m_agent_threads)._M_t._M_impl.super__Rb_tree_header,
             (anonymous_namespace)::
             call_shutdown<std::pair<so_5::agent_t_const*const,std::shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>>>
            );
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return iVar1;
}

Assistant:

virtual void
		shutdown() override
			{
				std::lock_guard< std::mutex > lock( m_lock );

				// During the shutdown new threads will not be created.
				m_shutdown_started = true;

				std::for_each(
					m_agent_threads.begin(),
					m_agent_threads.end(),
					call_shutdown< typename agent_thread_map_t::value_type > );
			}